

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-caps.c
# Opt level: O3

int lws_plat_user_colon_group_to_ids(char *u_colon_g,uid_t *puid,gid_t *pgid)

{
  char *pcVar1;
  group *pgVar2;
  passwd *ppVar3;
  ulong __n;
  char u [33];
  char acStack_58 [40];
  
  pcVar1 = strchr(u_colon_g,0x3a);
  if ((pcVar1 != (char *)0x0) && (0xffffffe0 < (int)((long)pcVar1 - (long)u_colon_g) - 0x21U)) {
    __n = (long)pcVar1 - (long)u_colon_g & 0xffffffff;
    memcpy(acStack_58,u_colon_g,__n);
    acStack_58[__n] = '\0';
    pgVar2 = getgrnam(pcVar1 + 1);
    pcVar1 = pcVar1 + 1;
    if (pgVar2 != (group *)0x0) {
      *pgid = pgVar2->gr_gid;
      ppVar3 = getpwnam(acStack_58);
      pcVar1 = acStack_58;
      if (ppVar3 != (passwd *)0x0) {
        *puid = ppVar3->pw_uid;
        return 0;
      }
    }
    _lws_log(1,"%s: unknown group \'%s\'\n","lws_plat_user_colon_group_to_ids",pcVar1);
  }
  return 1;
}

Assistant:

int
lws_plat_user_colon_group_to_ids(const char *u_colon_g, uid_t *puid, gid_t *pgid)
{
	char *colon = strchr(u_colon_g, ':'), u[33];
	struct passwd *p;
	struct group *g;
	int ulen;

	if (!colon)
		return 1;

	ulen = lws_ptr_diff(colon, u_colon_g);
	if (ulen < 2 || ulen > (int)sizeof(u) - 1)
		return 1;

	memcpy(u, u_colon_g, ulen);
	u[ulen] = '\0';

	colon++;

	g = getgrnam(colon);
	if (!g) {
		lwsl_err("%s: unknown group '%s'\n", __func__, colon);

		return 1;
	}
	*pgid = g->gr_gid;

	p = getpwnam(u);
	if (!p) {
		lwsl_err("%s: unknown group '%s'\n", __func__, u);

		return 1;
	}
	*puid = p->pw_uid;

	return 0;
}